

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O1

void safe_destroy(csafestring_t *obj)

{
  if (obj != (csafestring_t *)0x0) {
    if (obj->data != (char *)0x0) {
      free(obj->data);
    }
    free(obj);
    return;
  }
  return;
}

Assistant:

void safe_destroy(csafestring_t *obj) {
	if ( obj == NULL ) {
		return;
	}

	if ( obj->data != NULL ) {
		free(obj->data);
	}

#ifdef EXPERIMENTAL_SIZING
	sizing_size -= obj->sizing_size;
	sizing_count--;
#endif
	
	free(obj);
}